

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase368::run(TestCase368 *this)

{
  SourceLocation location;
  int iVar1;
  DebugExpression<bool> _kjCondition;
  PromiseFulfillerPair<void> pair;
  undefined8 in_stack_ffffffffffffff30;
  WaitScope waitScope;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  location.function =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location.fileName = (char *)in_stack_ffffffffffffff30;
  location._16_8_ = "run";
  newPromiseAndFulfiller<void>(location);
  iVar1 = (*((pair.fulfiller.ptr)->super_PromiseRejector)._vptr_PromiseRejector[1])();
  _kjCondition.value = SUB41(iVar1,0);
  if (kj::_::Debug::minSeverity < 3 && _kjCondition.value == false) {
    kj::_::Debug::log<char_const(&)[45],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x176,ERROR,"\"failed: expected \" \"pair.fulfiller->isWaiting()\", _kjCondition",
               (char (*) [45])"failed: expected pair.fulfiller->isWaiting()",&_kjCondition);
  }
  (*((pair.fulfiller.ptr)->super_PromiseRejector)._vptr_PromiseRejector[2])
            (pair.fulfiller.ptr,&_kjCondition);
  iVar1 = (*((pair.fulfiller.ptr)->super_PromiseRejector)._vptr_PromiseRejector[1])();
  _kjCondition.value = (bool)((byte)iVar1 ^ 1);
  if (((byte)iVar1 & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[48],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x178,ERROR,"\"failed: expected \" \"!(pair.fulfiller->isWaiting())\", _kjCondition"
               ,(char (*) [48])"failed: expected !(pair.fulfiller->isWaiting())",&_kjCondition);
  }
  Promise<void>::wait(&pair.promise,&waitScope);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair(&pair);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, SeparateFulfillerVoid) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<void>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.fulfiller->fulfill();
  EXPECT_FALSE(pair.fulfiller->isWaiting());

  pair.promise.wait(waitScope);
}